

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O0

vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
* vkt::anon_unknown_0::getVertexAttributeDescriptions
            (vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
             *__return_storage_ptr__,
            vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *inputValues,
            ValueBufferLayout *layout)

{
  bool bVar1;
  DataType DVar2;
  VkFormat VVar3;
  Value *pVVar4;
  const_reference this;
  const_reference pvVar5;
  size_type sVar6;
  int local_b8;
  int local_b0;
  undefined1 local_90 [8];
  VkVertexInputAttributeDescription desc;
  deUint32 offset;
  deUint32 curLoc;
  int vecNdx;
  VkFormat vecFmt;
  DataType scalarType;
  int vecSize;
  int numVecs;
  DataType basicType;
  Entry *layoutEntry;
  Value *input;
  size_t inputNdx;
  undefined1 auStack_38 [8];
  VkVertexInputAttributeDescription posDesc;
  ValueBufferLayout *layout_local;
  vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *inputValues_local;
  vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  *attribs;
  
  posDesc.offset._3_1_ = 0;
  std::
  vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ::vector(__return_storage_ptr__);
  auStack_38._0_4_ = 0;
  auStack_38._4_4_ = 0;
  posDesc.location = 0x67;
  posDesc.binding = 0;
  std::
  vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ::push_back(__return_storage_ptr__,(value_type *)auStack_38);
  for (input = (Value *)0x0;
      pVVar4 = (Value *)std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::size
                                  (inputValues), input < pVVar4;
      input = (Value *)((long)&(input->type).m_type + 1)) {
    this = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator[]
                     (inputValues,(size_type)input);
    pvVar5 = std::
             vector<vkt::(anonymous_namespace)::ValueBufferLayout::Entry,_std::allocator<vkt::(anonymous_namespace)::ValueBufferLayout::Entry>_>
             ::operator[](&layout->entries,(size_type)input);
    DVar2 = glu::VarType::getBasicType(&this->type);
    bVar1 = glu::isDataTypeMatrix(DVar2);
    if (bVar1) {
      local_b0 = glu::getDataTypeMatrixNumColumns(DVar2);
    }
    else {
      local_b0 = 1;
    }
    bVar1 = glu::isDataTypeMatrix(DVar2);
    if (bVar1) {
      local_b8 = glu::getDataTypeMatrixNumRows(DVar2);
    }
    else {
      local_b8 = glu::getDataTypeScalarSize(DVar2);
    }
    DVar2 = glu::getDataTypeScalarType(DVar2);
    VVar3 = getVecFormat(DVar2,local_b8);
    for (offset = 0; (int)offset < local_b0; offset = offset + 1) {
      sVar6 = std::
              vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
              ::size(__return_storage_ptr__);
      local_90._0_4_ = (undefined4)sVar6;
      desc.binding = pvVar5->offset + pvVar5->vecStride * offset;
      local_90._4_4_ = 1;
      desc.location = VVar3;
      desc.format = desc.binding;
      desc.offset = local_90._0_4_;
      std::
      vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_90);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<vk::VkVertexInputAttributeDescription> getVertexAttributeDescriptions (const vector<Value>& inputValues, const ValueBufferLayout& layout)
{
	vector<vk::VkVertexInputAttributeDescription>	attribs;

	// Position
	{
		const vk::VkVertexInputAttributeDescription	posDesc	=
		{
			0u,								// location
			0u,								// binding
			vk::VK_FORMAT_R32G32_SFLOAT,	// format
			0u,								// offset
		};

		attribs.push_back(posDesc);
	}

	// Input values
	for (size_t inputNdx = 0; inputNdx < inputValues.size(); inputNdx++)
	{
		const Value&					input		= inputValues[inputNdx];
		const ValueBufferLayout::Entry&	layoutEntry	= layout.entries[inputNdx];
		const DataType					basicType	= input.type.getBasicType();
		const int						numVecs		= isDataTypeMatrix(basicType)
													? getDataTypeMatrixNumColumns(basicType)
													: 1;
		const int						vecSize		= isDataTypeMatrix(basicType)
													? getDataTypeMatrixNumRows(basicType)
													: getDataTypeScalarSize(basicType);
		const DataType					scalarType	= getDataTypeScalarType(basicType);
		const vk::VkFormat				vecFmt		= getVecFormat(scalarType, vecSize);

		for (int vecNdx = 0; vecNdx < numVecs; vecNdx++)
		{
			const deUint32								curLoc	= (deUint32)attribs.size();
			const deUint32								offset	= (deUint32)(layoutEntry.offset + layoutEntry.vecStride*vecNdx);
			const vk::VkVertexInputAttributeDescription	desc	=
			{
				curLoc,		// location
				1u,			// binding
				vecFmt,		// format
				offset,		// offset
			};

			attribs.push_back(desc);
		}
	}

	return attribs;
}